

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall ChainstateManager::LoadBlockIndex(ChainstateManager *this)

{
  long lVar1;
  CBlockIndex *pCVar2;
  bool bVar3;
  undefined1 uVar4;
  CBlockIndex *pindex_00;
  iterator iVar5;
  iterator iVar6;
  reference ppCVar7;
  CBlockIndex *pCVar8;
  reference ppCVar9;
  long in_RDI;
  long in_FS_OFFSET;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range4;
  CBlockIndex *pindex;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *__range2;
  bool ret;
  iterator __end4;
  iterator __begin4;
  iterator __end2;
  iterator __begin2;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  CBlockIndex *in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffed9;
  undefined1 in_stack_fffffffffffffeda;
  undefined1 in_stack_fffffffffffffedb;
  undefined1 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffedd;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  atomic<bool> *in_stack_fffffffffffffee0;
  CBlockIndex *this_00;
  ChainstateManager *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  ChainstateManager *in_stack_ffffffffffffff18;
  byte local_82;
  optional<uint256> *in_stack_ffffffffffffffd0;
  BlockManager *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,
                                       CONCAT15(in_stack_fffffffffffffedd,
                                                CONCAT14(in_stack_fffffffffffffedc,
                                                         CONCAT13(in_stack_fffffffffffffedb,
                                                                  CONCAT12(in_stack_fffffffffffffeda
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffed9,
                                                  in_stack_fffffffffffffed8))))))),
             (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             (AnnotatedMixin<std::recursive_mutex> *)0x14a7320);
  bVar3 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffee0);
  if (bVar3) {
    pindex_00 = (CBlockIndex *)(in_RDI + 0x7f8);
    SnapshotBlockhash(in_stack_fffffffffffffee8);
    bVar3 = ::node::BlockManager::LoadBlockIndexDB
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (!bVar3) {
      local_82 = 0;
      goto LAB_014a7730;
    }
    ::node::BlockManager::ScanAndUnlinkAlreadyPrunedFiles((BlockManager *)(in_RDI + 0x7f8));
    ::node::BlockManager::GetAllBlockIndices((BlockManager *)in_stack_ffffffffffffff18);
    iVar5 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::begin
                      ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                       in_stack_fffffffffffffed0);
    iVar6 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::end
                      ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
                       in_stack_fffffffffffffed0);
    std::
    sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,node::CBlockIndexHeightOnlyComparator>
              (iVar5._M_current,iVar6._M_current);
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::begin
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_stack_fffffffffffffed0);
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::end
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_stack_fffffffffffffed0);
    while (bVar3 = __gnu_cxx::
                   operator==<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                             ((__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                               *)CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT16(in_stack_fffffffffffffede,
                                                   CONCAT15(in_stack_fffffffffffffedd,
                                                            CONCAT14(in_stack_fffffffffffffedc,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffedb,
                                                  CONCAT12(in_stack_fffffffffffffeda,
                                                           CONCAT11(in_stack_fffffffffffffed9,
                                                                    in_stack_fffffffffffffed8)))))))
                              ,(__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                                *)in_stack_fffffffffffffed0), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                ::operator*((__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      pCVar2 = *ppCVar7;
      uVar4 = util::SignalInterrupt::operator_cast_to_bool
                        ((SignalInterrupt *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if ((bool)uVar4) {
        local_82 = 0;
        bVar3 = true;
        goto LAB_014a76fe;
      }
      this_00 = pCVar2;
      pCVar8 = GetSnapshotBaseBlock
                         ((ChainstateManager *)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,
                                            CONCAT15(in_stack_fffffffffffffedd,
                                                     CONCAT14(in_stack_fffffffffffffedc,
                                                              CONCAT13(in_stack_fffffffffffffedb,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeda,
                                                  CONCAT11(in_stack_fffffffffffffed9,
                                                           in_stack_fffffffffffffed8))))))));
      if ((this_00 == pCVar8) ||
         ((in_stack_fffffffffffffedf =
                CBlockIndex::IsValid
                          (this_00,CONCAT13(in_stack_fffffffffffffedf,
                                            CONCAT12(in_stack_fffffffffffffede,
                                                     CONCAT11(in_stack_fffffffffffffedd,
                                                              in_stack_fffffffffffffedc)))),
          (bool)in_stack_fffffffffffffedf &&
          ((in_stack_fffffffffffffede =
                 CBlockIndex::HaveNumChainTxs
                           ((CBlockIndex *)
                            CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
           (bool)in_stack_fffffffffffffede || (pCVar2->pprev == (CBlockIndex *)0x0)))))) {
        GetAll(in_stack_ffffffffffffff18);
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffed0)
        ;
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffed0)
        ;
        while (bVar3 = __gnu_cxx::
                       operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffedf,
                                              CONCAT16(in_stack_fffffffffffffede,
                                                       CONCAT15(in_stack_fffffffffffffedd,
                                                                CONCAT14(in_stack_fffffffffffffedc,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffedb,
                                                  CONCAT12(in_stack_fffffffffffffeda,
                                                           CONCAT11(in_stack_fffffffffffffed9,
                                                                    in_stack_fffffffffffffed8)))))))
                                  ,(__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                    *)in_stack_fffffffffffffed0), ((bVar3 ^ 0xffU) & 1) != 0) {
          ppCVar9 = __gnu_cxx::
                    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                    ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_ffffffffffffff18 = (ChainstateManager *)*ppCVar9;
          Chainstate::TryAddBlockIndexCandidate
                    ((Chainstate *)CONCAT17(uVar4,in_stack_fffffffffffffef0),pindex_00);
          __gnu_cxx::
          __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
          ::operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
        std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                  ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)
                   CONCAT17(in_stack_fffffffffffffedf,
                            CONCAT16(in_stack_fffffffffffffede,
                                     CONCAT15(in_stack_fffffffffffffedd,
                                              CONCAT14(in_stack_fffffffffffffedc,
                                                       CONCAT13(in_stack_fffffffffffffedb,
                                                                CONCAT12(in_stack_fffffffffffffeda,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffed9,
                                                  in_stack_fffffffffffffed8))))))));
      }
      if (((pCVar2->nStatus & 0x60) != 0) &&
         ((*(long *)(in_RDI + 0x18) == 0 ||
          (in_stack_fffffffffffffedd =
                operator>((base_uint<256U> *)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,
                                            CONCAT15(in_stack_fffffffffffffedd,
                                                     CONCAT14(in_stack_fffffffffffffedc,
                                                              CONCAT13(in_stack_fffffffffffffedb,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeda,
                                                  CONCAT11(in_stack_fffffffffffffed9,
                                                           in_stack_fffffffffffffed8))))))),
                          (base_uint<256U> *)in_stack_fffffffffffffed0),
          (bool)in_stack_fffffffffffffedd)))) {
        *(CBlockIndex **)(in_RDI + 0x18) = pCVar2;
      }
      in_stack_fffffffffffffedc =
           CBlockIndex::IsValid
                     (this_00,CONCAT13(in_stack_fffffffffffffedf,
                                       CONCAT12(in_stack_fffffffffffffede,
                                                CONCAT11(in_stack_fffffffffffffedd,
                                                         in_stack_fffffffffffffedc))));
      in_stack_fffffffffffffedb = false;
      if (((bool)in_stack_fffffffffffffedc) &&
         (in_stack_fffffffffffffeda = true, in_stack_fffffffffffffedb = true,
         *(long *)(in_RDI + 0xce8) != 0)) {
        in_stack_fffffffffffffed9 =
             ::node::CBlockIndexWorkComparator::operator()
                       ((CBlockIndexWorkComparator *)this_00,
                        (CBlockIndex *)
                        CONCAT17(in_stack_fffffffffffffedf,
                                 CONCAT16(in_stack_fffffffffffffede,
                                          CONCAT15(in_stack_fffffffffffffedd,
                                                   CONCAT14(in_stack_fffffffffffffedc,
                                                            (uint)CONCAT12(1,CONCAT11(
                                                  in_stack_fffffffffffffed9,
                                                  in_stack_fffffffffffffed8)))))),
                        in_stack_fffffffffffffed0);
        in_stack_fffffffffffffeda = in_stack_fffffffffffffed9;
        in_stack_fffffffffffffedb = in_stack_fffffffffffffed9;
      }
      if ((bool)in_stack_fffffffffffffedb != false) {
        *(CBlockIndex **)(in_RDI + 0xce8) = pCVar2;
      }
      __gnu_cxx::
      __normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
      ::operator++((__normal_iterator<CBlockIndex_**,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    bVar3 = false;
LAB_014a76fe:
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~vector
              ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,
                                 CONCAT15(in_stack_fffffffffffffedd,
                                          CONCAT14(in_stack_fffffffffffffedc,
                                                   CONCAT13(in_stack_fffffffffffffedb,
                                                            CONCAT12(in_stack_fffffffffffffeda,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffed9,
                                                  in_stack_fffffffffffffed8))))))));
    if (bVar3) goto LAB_014a7730;
  }
  local_82 = 1;
LAB_014a7730:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_82 & 1);
}

Assistant:

bool ChainstateManager::LoadBlockIndex()
{
    AssertLockHeld(cs_main);
    // Load block index from databases
    if (m_blockman.m_blockfiles_indexed) {
        bool ret{m_blockman.LoadBlockIndexDB(SnapshotBlockhash())};
        if (!ret) return false;

        m_blockman.ScanAndUnlinkAlreadyPrunedFiles();

        std::vector<CBlockIndex*> vSortedByHeight{m_blockman.GetAllBlockIndices()};
        std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
                  CBlockIndexHeightOnlyComparator());

        for (CBlockIndex* pindex : vSortedByHeight) {
            if (m_interrupt) return false;
            // If we have an assumeutxo-based chainstate, then the snapshot
            // block will be a candidate for the tip, but it may not be
            // VALID_TRANSACTIONS (eg if we haven't yet downloaded the block),
            // so we special-case the snapshot block as a potential candidate
            // here.
            if (pindex == GetSnapshotBaseBlock() ||
                    (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                     (pindex->HaveNumChainTxs() || pindex->pprev == nullptr))) {

                for (Chainstate* chainstate : GetAll()) {
                    chainstate->TryAddBlockIndexCandidate(pindex);
                }
            }
            if (pindex->nStatus & BLOCK_FAILED_MASK && (!m_best_invalid || pindex->nChainWork > m_best_invalid->nChainWork)) {
                m_best_invalid = pindex;
            }
            if (pindex->IsValid(BLOCK_VALID_TREE) && (m_best_header == nullptr || CBlockIndexWorkComparator()(m_best_header, pindex)))
                m_best_header = pindex;
        }
    }
    return true;
}